

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int lyxml_dump_text(lyout *out,char *text)

{
  byte bVar1;
  int iVar2;
  char *format;
  ulong uVar3;
  int iVar4;
  
  if (text == (char *)0x0) {
    return 0;
  }
  uVar3 = 0;
  iVar4 = 0;
  do {
    bVar1 = text[uVar3];
    if (bVar1 < 0x3c) {
      if (bVar1 == 0x22) {
        format = "&quot;";
        goto LAB_0012236c;
      }
      if (bVar1 == 0x26) {
        format = "&amp;";
        goto LAB_0012236c;
      }
      if (bVar1 == 0) {
        return iVar4;
      }
LAB_0012237f:
      ly_write(out,text + uVar3,1);
      iVar4 = iVar4 + 1;
    }
    else {
      if (bVar1 == 0x3c) {
        format = "&lt;";
      }
      else {
        if (bVar1 != 0x3e) goto LAB_0012237f;
        format = "&gt;";
      }
LAB_0012236c:
      iVar2 = ly_print(out,format);
      iVar4 = iVar4 + iVar2;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  } while( true );
}

Assistant:

int
lyxml_dump_text(struct lyout *out, const char *text)
{
    unsigned int i, n;

    if (!text) {
        return 0;
    }

    for (i = n = 0; text[i]; i++) {
        switch (text[i]) {
        case '&':
            n += ly_print(out, "&amp;");
            break;
        case '<':
            n += ly_print(out, "&lt;");
            break;
        case '>':
            /* not needed, just for readability */
            n += ly_print(out, "&gt;");
            break;
        case '"':
            n += ly_print(out, "&quot;");
            break;
        default:
            ly_write(out, &text[i], 1);
            n++;
        }
    }

    return n;
}